

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::UnpackedStructType::getDefaultValueImpl(UnpackedStructType *this)

{
  bool bVar1;
  long in_RSI;
  Type *in_RDI;
  FieldSymbol *field;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *__range2;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> elements;
  span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *in_stack_ffffffffffffff58;
  Type *in_stack_ffffffffffffff60;
  Type *this_00;
  __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
  local_38;
  long local_30;
  
  this_00 = in_RDI;
  std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::vector
            ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)0x9f0ebe);
  local_30 = in_RSI + 0x80;
  local_38._M_current =
       (FieldSymbol **)
       std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::begin
                 (in_stack_ffffffffffffff58);
  std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::end
            ((span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff58);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
    ::operator*(&local_38);
    in_stack_ffffffffffffff60 = ValueSymbol::getType((ValueSymbol *)0x9f0f22);
    Type::getDefaultValue(in_RDI);
    std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
    emplace_back<slang::ConstantValue>
              ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)this_00,
               (ConstantValue *)in_RDI);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x9f0f58);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
    ::operator++(&local_38);
  }
  slang::ConstantValue::ConstantValue
            ((ConstantValue *)in_stack_ffffffffffffff60,(Elements *)in_stack_ffffffffffffff58);
  std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
            ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)this_00);
  return (ConstantValue *)this_00;
}

Assistant:

ConstantValue UnpackedStructType::getDefaultValueImpl() const {
    std::vector<ConstantValue> elements;
    for (auto field : fields)
        elements.emplace_back(field->getType().getDefaultValue());

    return elements;
}